

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

void __thiscall
flatbuffers::php::PhpGenerator::GenStruct(PhpGenerator *this,StructDef *struct_def,string *code_ptr)

{
  byte bVar1;
  Parser *pPVar2;
  pointer ppFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((struct_def->super_Definition).generated == false) {
    GenComment(&(struct_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    BeginClass(struct_def,code_ptr);
    bVar1 = struct_def->fixed;
    if ((bool)bVar1 == false) {
      NewRootTypeFromBuffer(struct_def,code_ptr);
      bVar1 = struct_def->fixed;
    }
    if ((bVar1 & 1) == 0) {
      pPVar2 = (this->super_BaseGenerator).parser_;
      if ((pPVar2->file_identifier_)._M_string_length != 0) {
        std::operator+(&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"public static function ");
        std::operator+(&local_80,&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       struct_def);
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::append((char *)code_ptr);
        std::operator+(&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"{\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::operator+(&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_);
        std::operator+(&local_80,&local_60,"return \"");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        std::operator+(&local_80,&((this->super_BaseGenerator).parser_)->file_identifier_,"\";\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::operator+(&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"}\n\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::operator+(&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"public static function ");
        std::operator+(&local_80,&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       struct_def);
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::append((char *)code_ptr);
        std::operator+(&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"{\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::operator+(&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_);
        std::operator+(&local_80,&local_60,"return self::");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::append((char *)code_ptr);
        std::operator+(&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       struct_def,"Identifier());\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::operator+(&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"}\n\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        pPVar2 = (this->super_BaseGenerator).parser_;
      }
      if ((pPVar2->file_extension_)._M_string_length != 0) {
        std::operator+(&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"public static function ");
        std::operator+(&local_80,&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       struct_def);
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::append((char *)code_ptr);
        std::operator+(&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"{\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::operator+(&local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_);
        std::operator+(&local_60,&local_40,"return \"");
        std::operator+(&local_80,&local_60,&((this->super_BaseGenerator).parser_)->file_extension_);
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::append((char *)code_ptr);
        std::operator+(&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &Indent_abi_cxx11_,"}\n\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_80);
      }
    }
    InitializeExisting(struct_def,code_ptr);
    for (ppFVar3 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar3 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
      if ((*ppFVar3)->deprecated == false) {
        GenStructAccessor(this,struct_def,*ppFVar3,code_ptr);
      }
    }
    if (struct_def->fixed == false) {
      GenTableBuilders(this,struct_def,code_ptr);
    }
    else {
      GenStructBuilder(struct_def,code_ptr);
    }
    EndClass(code_ptr);
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def, std::string *code_ptr) {
    if (struct_def.generated) return;

    GenComment(struct_def.doc_comment, code_ptr, nullptr);
    BeginClass(struct_def, code_ptr);

    if (!struct_def.fixed) {
      // Generate a special accessor for the table that has been declared as
      // the root type.
      NewRootTypeFromBuffer(struct_def, code_ptr);
    }

    std::string &code = *code_ptr;
    if (!struct_def.fixed) {
      if (parser_.file_identifier_.length()) {
        // Return the identifier
        code += Indent + "public static function " + struct_def.name;
        code += "Identifier()\n";
        code += Indent + "{\n";
        code += Indent + Indent + "return \"";
        code += parser_.file_identifier_ + "\";\n";
        code += Indent + "}\n\n";

        // Check if a buffer has the identifier.
        code += Indent + "public static function " + struct_def.name;
        code += "BufferHasIdentifier(ByteBuffer $buf)\n";
        code += Indent + "{\n";
        code += Indent + Indent + "return self::";
        code += "__has_identifier($buf, self::";
        code += struct_def.name + "Identifier());\n";
        code += Indent + "}\n\n";
      }

      if (parser_.file_extension_.length()) {
        // Return the extension
        code += Indent + "public static function " + struct_def.name;
        code += "Extension()\n";
        code += Indent + "{\n";
        code += Indent + Indent + "return \"" + parser_.file_extension_;
        code += "\";\n";
        code += Indent + "}\n\n";
      }
    }

    // Generate the Init method that sets the field in a pre-existing
    // accessor object. This is to allow object reuse.
    InitializeExisting(struct_def, code_ptr);
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      GenStructAccessor(struct_def, field, code_ptr);
    }

    if (struct_def.fixed) {
      // create a struct constructor function
      GenStructBuilder(struct_def, code_ptr);
    } else {
      // Create a set of functions that allow table construction.
      GenTableBuilders(struct_def, code_ptr);
    }
    EndClass(code_ptr);
  }